

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fseek.c
# Opt level: O3

int main(void)

{
  int iVar1;
  FILE *__s;
  size_t sVar2;
  long lVar3;
  
  __s = tmpfile();
  if (__s == (FILE *)0x0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/stdio/fseek.c, line %d - %s\n"
           ,0x3b,"( fh = tmpfile() ) != NULL");
  }
  sVar2 = fwrite("1234567890\nABCDEFGHIJKLMNOPQRSTUVWXYZ\nabcdefghijklmnopqrstuvwxyz\n",1,0x41,__s);
  if (sVar2 != 0x41) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/stdio/fseek.c, line %d - %s\n"
           ,0x3c,"fwrite( teststring, 1, strlen( teststring ), fh ) == strlen( teststring )");
  }
  iVar1 = fseek(__s,-1,2);
  if (iVar1 != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/stdio/fseek.c, line %d - %s\n"
           ,0x3e,"fseek( fh, -1, SEEK_END ) == 0");
  }
  lVar3 = ftell(__s);
  if (lVar3 != 0x40) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/stdio/fseek.c, line %d - %s\n"
           ,0x3f,"( size_t )ftell( fh ) == strlen( teststring ) - 1");
  }
  iVar1 = fseek(__s,0,2);
  if (iVar1 != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/stdio/fseek.c, line %d - %s\n"
           ,0x40,"fseek( fh, 0, SEEK_END ) == 0");
  }
  lVar3 = ftell(__s);
  if (lVar3 != 0x41) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/stdio/fseek.c, line %d - %s\n"
           ,0x41,"( size_t )ftell( fh ) == strlen( teststring )");
  }
  iVar1 = fseek(__s,0,0);
  if (iVar1 != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/stdio/fseek.c, line %d - %s\n"
           ,0x42,"fseek( fh, 0, SEEK_SET ) == 0");
  }
  lVar3 = ftell(__s);
  if (lVar3 != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/stdio/fseek.c, line %d - %s\n"
           ,0x43,"ftell( fh ) == 0");
  }
  iVar1 = fseek(__s,5,1);
  if (iVar1 != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/stdio/fseek.c, line %d - %s\n"
           ,0x44,"fseek( fh, 5, SEEK_CUR ) == 0");
  }
  lVar3 = ftell(__s);
  if (lVar3 != 5) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/stdio/fseek.c, line %d - %s\n"
           ,0x45,"ftell( fh ) == 5");
  }
  iVar1 = fseek(__s,-3,1);
  if (iVar1 != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/stdio/fseek.c, line %d - %s\n"
           ,0x46,"fseek( fh, -3, SEEK_CUR ) == 0");
  }
  lVar3 = ftell(__s);
  if (lVar3 != 2) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/stdio/fseek.c, line %d - %s\n"
           ,0x47,"ftell( fh ) == 2");
  }
  iVar1 = fseek(__s,0,2);
  if (iVar1 != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/stdio/fseek.c, line %d - %s\n"
           ,0x49,"fseek( fh, 0, SEEK_END ) == 0");
  }
  iVar1 = feof(__s);
  if (iVar1 != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/stdio/fseek.c, line %d - %s\n"
           ,0x4a,"! feof( fh )");
  }
  iVar1 = fgetc(__s);
  if (iVar1 != -1) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/stdio/fseek.c, line %d - %s\n"
           ,0x4b,"fgetc( fh ) == EOF");
  }
  iVar1 = feof(__s);
  if (iVar1 == 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/stdio/fseek.c, line %d - %s\n"
           ,0x4c,"feof( fh )");
  }
  iVar1 = fseek(__s,0,2);
  if (iVar1 != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/stdio/fseek.c, line %d - %s\n"
           ,0x4d,"fseek( fh, 0, SEEK_END ) == 0");
  }
  iVar1 = feof(__s);
  if (iVar1 != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/stdio/fseek.c, line %d - %s\n"
           ,0x4e,"! feof( fh )");
  }
  iVar1 = fseek(__s,0,0);
  if (iVar1 != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/stdio/fseek.c, line %d - %s\n"
           ,0x50,"fseek( fh, 0, SEEK_SET ) == 0");
  }
  iVar1 = fgetc(__s);
  if (iVar1 != 0x31) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/stdio/fseek.c, line %d - %s\n"
           ,0x51,"fgetc( fh ) == teststring[0]");
  }
  iVar1 = fgetc(__s);
  if (iVar1 != 0x32) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/stdio/fseek.c, line %d - %s\n"
           ,0x52,"fgetc( fh ) == teststring[1]");
  }
  iVar1 = fgetc(__s);
  if (iVar1 != 0x33) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/stdio/fseek.c, line %d - %s\n"
           ,0x53,"fgetc( fh ) == teststring[2]");
  }
  lVar3 = ftell(__s);
  if (lVar3 != 3) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/stdio/fseek.c, line %d - %s\n"
           ,0x54,"ftell( fh ) == 3");
  }
  iVar1 = ungetc(0x33,__s);
  if (iVar1 != 0x33) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/stdio/fseek.c, line %d - %s\n"
           ,0x55,"ungetc( teststring[2], fh ) == teststring[2]");
  }
  lVar3 = ftell(__s);
  if (lVar3 != 2) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/stdio/fseek.c, line %d - %s\n"
           ,0x56,"ftell( fh ) == 2");
  }
  iVar1 = fgetc(__s);
  if (iVar1 != 0x33) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/stdio/fseek.c, line %d - %s\n"
           ,0x57,"fgetc( fh ) == teststring[2]");
  }
  lVar3 = ftell(__s);
  if (lVar3 != 3) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/stdio/fseek.c, line %d - %s\n"
           ,0x58,"ftell( fh ) == 3");
  }
  iVar1 = ungetc(0x78,__s);
  if (iVar1 != 0x78) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/stdio/fseek.c, line %d - %s\n"
           ,0x59,"ungetc( \'x\', fh ) == \'x\'");
  }
  lVar3 = ftell(__s);
  if (lVar3 != 2) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/stdio/fseek.c, line %d - %s\n"
           ,0x5a,"ftell( fh ) == 2");
  }
  iVar1 = fgetc(__s);
  if (iVar1 != 0x78) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/stdio/fseek.c, line %d - %s\n"
           ,0x5b,"fgetc( fh ) == \'x\'");
  }
  iVar1 = ungetc(0x78,__s);
  if (iVar1 != 0x78) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/stdio/fseek.c, line %d - %s\n"
           ,0x5c,"ungetc( \'x\', fh ) == \'x\'");
  }
  lVar3 = ftell(__s);
  if (lVar3 != 2) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/stdio/fseek.c, line %d - %s\n"
           ,0x5d,"ftell( fh ) == 2");
  }
  iVar1 = fseek(__s,2,0);
  if (iVar1 != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/stdio/fseek.c, line %d - %s\n"
           ,0x5e,"fseek( fh, 2, SEEK_SET ) == 0");
  }
  iVar1 = fgetc(__s);
  if (iVar1 != 0x33) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/stdio/fseek.c, line %d - %s\n"
           ,0x5f,"fgetc( fh ) == teststring[2]");
  }
  iVar1 = fseek(__s,-5,0);
  if (iVar1 != -1) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/stdio/fseek.c, line %d - %s\n"
           ,0x61,"fseek( fh, -5, SEEK_SET ) == -1");
  }
  iVar1 = fseek(__s,0,2);
  if (iVar1 != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/stdio/fseek.c, line %d - %s\n"
           ,0x62,"fseek( fh, 0, SEEK_END ) == 0");
  }
  iVar1 = fclose(__s);
  if (iVar1 != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/stdio/fseek.c, line %d - %s\n"
           ,99,"fclose( fh ) == 0");
  }
  return TEST_RESULTS;
}

Assistant:

int main( void )
{
    FILE * fh;
    TESTCASE( ( fh = tmpfile() ) != NULL );
    TESTCASE( fwrite( teststring, 1, strlen( teststring ), fh ) == strlen( teststring ) );
    /* General functionality */
    TESTCASE( fseek( fh, -1, SEEK_END ) == 0 );
    TESTCASE( ( size_t )ftell( fh ) == strlen( teststring ) - 1 );
    TESTCASE( fseek( fh, 0, SEEK_END ) == 0 );
    TESTCASE( ( size_t )ftell( fh ) == strlen( teststring ) );
    TESTCASE( fseek( fh, 0, SEEK_SET ) == 0 );
    TESTCASE( ftell( fh ) == 0 );
    TESTCASE( fseek( fh, 5, SEEK_CUR ) == 0 );
    TESTCASE( ftell( fh ) == 5 );
    TESTCASE( fseek( fh, -3, SEEK_CUR ) == 0 );
    TESTCASE( ftell( fh ) == 2 );
    /* Checking behaviour around EOF */
    TESTCASE( fseek( fh, 0, SEEK_END ) == 0 );
    TESTCASE( ! feof( fh ) );
    TESTCASE( fgetc( fh ) == EOF );
    TESTCASE( feof( fh ) );
    TESTCASE( fseek( fh, 0, SEEK_END ) == 0 );
    TESTCASE( ! feof( fh ) );
    /* Checking undo of ungetc() */
    TESTCASE( fseek( fh, 0, SEEK_SET ) == 0 );
    TESTCASE( fgetc( fh ) == teststring[0] );
    TESTCASE( fgetc( fh ) == teststring[1] );
    TESTCASE( fgetc( fh ) == teststring[2] );
    TESTCASE( ftell( fh ) == 3 );
    TESTCASE( ungetc( teststring[2], fh ) == teststring[2] );
    TESTCASE( ftell( fh ) == 2 );
    TESTCASE( fgetc( fh ) == teststring[2] );
    TESTCASE( ftell( fh ) == 3 );
    TESTCASE( ungetc( 'x', fh ) == 'x' );
    TESTCASE( ftell( fh ) == 2 );
    TESTCASE( fgetc( fh ) == 'x' );
    TESTCASE( ungetc( 'x', fh ) == 'x' );
    TESTCASE( ftell( fh ) == 2 );
    TESTCASE( fseek( fh, 2, SEEK_SET ) == 0 );
    TESTCASE( fgetc( fh ) == teststring[2] );
    /* Checking error handling */
    TESTCASE( fseek( fh, -5, SEEK_SET ) == -1 );
    TESTCASE( fseek( fh, 0, SEEK_END ) == 0 );
    TESTCASE( fclose( fh ) == 0 );
    return TEST_RESULTS;
}